

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchmanager.cpp
# Opt level: O0

void __thiscall QEvdevTouchManager::updateInputDeviceCount(QEvdevTouchManager *this)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  QInputDeviceManagerPrivate *pQVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  Device *device;
  DeviceHandlerList<QEvdevTouchScreenHandlerThread> *__range1;
  int registeredTouchDevices;
  const_iterator __end1;
  const_iterator __begin1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  reference in_stack_ffffffffffffff98;
  bool *this_01;
  uint local_54;
  char local_48 [32];
  Device *local_28;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
  local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = 0;
  this_01 = &in_RDI[2].control;
  local_20._M_current = (Device *)0xaaaaaaaaaaaaaaaa;
  local_20._M_current =
       (Device *)
       QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::begin
                 ((DeviceHandlerList<QEvdevTouchScreenHandlerThread> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_28 = (Device *)0xaaaaaaaaaaaaaaaa;
  local_28 = (Device *)
             QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::end
                       ((DeviceHandlerList<QEvdevTouchScreenHandlerThread> *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)), bVar1
        ) {
    in_stack_ffffffffffffff98 =
         __gnu_cxx::
         __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
         ::operator*(&local_20);
    this_00 = std::
              unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
              ::operator->((unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                            *)0x108f1c);
    bVar1 = QEvdevTouchScreenHandlerThread::isPointingDeviceRegistered
                      ((QEvdevTouchScreenHandlerThread *)this_00);
    if (bVar1) {
      local_54 = local_54 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>_>
    ::operator++(&local_20);
  }
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevTouch();
  anon_unknown.dwarf_2bb39::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RDI,(QLoggingCategory *)
                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_2bb39::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x108f87);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_01,(char *)in_stack_ffffffffffffff98,
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)0x108f9d);
    in_stack_ffffffffffffff8c = local_54;
    iVar2 = QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::count
                      ((DeviceHandlerList<QEvdevTouchScreenHandlerThread> *)0x108fb3);
    QMessageLogger::debug
              (local_48,
               "evdevtouch: Updating QInputDeviceManager device count: %d touch devices, %d pending handler(s)"
               ,(ulong)in_stack_ffffffffffffff8c,(ulong)(iVar2 - local_54));
    local_10 = 0;
  }
  QGuiApplicationPrivate::inputDeviceManager();
  pQVar3 = QInputDeviceManagerPrivate::get((QInputDeviceManager *)0x108fe4);
  QInputDeviceManagerPrivate::setDeviceCount((DeviceType)pQVar3,3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevTouchManager::updateInputDeviceCount()
{
    int registeredTouchDevices = 0;
    for (const auto &device : m_activeDevices) {
        if (device.handler->isPointingDeviceRegistered())
            ++registeredTouchDevices;
    }

    qCDebug(qLcEvdevTouch, "evdevtouch: Updating QInputDeviceManager device count: %d touch devices, %d pending handler(s)",
            registeredTouchDevices, m_activeDevices.count() - registeredTouchDevices);

    QInputDeviceManagerPrivate::get(QGuiApplicationPrivate::inputDeviceManager())->setDeviceCount(
        QInputDeviceManager::DeviceTypeTouch, registeredTouchDevices);
}